

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx::OrientedDiscMiMBIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [24];
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  Scene *pSVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  float fVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar53;
  float fVar55;
  undefined1 auVar54 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar61;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  int local_314;
  Scene *local_310;
  RayQueryContext *local_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2d0;
  undefined4 local_2cc;
  float local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  Primitive *local_2a0;
  RayHit *local_298;
  RTCFilterFunctionNArguments local_290;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0 [4];
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar52 [64];
  
  local_2a0 = Disc;
  local_298 = ray;
  local_308 = context;
  pSVar25 = context->scene;
  uVar17 = Disc->sharedGeomID;
  local_310 = pSVar25;
  pGVar7 = (pSVar25->geometries).items[uVar17].ptr;
  fVar37 = (pGVar7->time_range).lower;
  fVar37 = pGVar7->fnumTimeSegments *
           (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar37) /
           ((pGVar7->time_range).upper - fVar37));
  auVar11 = vroundss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),9);
  auVar11 = vminss_avx(auVar11,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar11 = vmaxss_avx(ZEXT816(0) << 0x20,auVar11);
  iVar16 = (int)auVar11._0_4_;
  uVar30 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar8 = *(long *)&pGVar7[2].numPrimitives;
  lVar18 = (long)iVar16 * 0x38;
  lVar9 = *(long *)(lVar8 + lVar18);
  lVar22 = *(long *)(lVar8 + 0x10 + lVar18);
  uVar28 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar23 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar21 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar27 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar27);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar30);
  uVar24 = (ulong)(Disc->primIDs).field_0.i[5];
  puVar1 = (undefined8 *)(lVar9 + lVar22 * uVar24);
  uStack_2f0 = *puVar1;
  _local_300 = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar28);
  uStack_2e8 = puVar1[1];
  uVar29 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar50._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar29);
  auVar50._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar23);
  uVar26 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar54._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar26);
  auVar54._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar21);
  p_Var10 = pGVar7[2].intersectionFilterN;
  lVar9 = *(long *)(p_Var10 + lVar18);
  lVar22 = *(long *)(p_Var10 + lVar18 + 0x10);
  auVar56._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar27);
  auVar56._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar30);
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar24);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar28);
  auVar42._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar29);
  auVar42._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar23);
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar26);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar22 * uVar21);
  lVar22 = (long)(iVar16 + 1) * 0x38;
  lVar9 = *(long *)(lVar8 + lVar22);
  lVar8 = *(long *)(lVar8 + 0x10 + lVar22);
  auVar71._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar27);
  auVar71._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar30);
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar24);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar28);
  auVar74._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar29);
  auVar74._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar23);
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar26);
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar21);
  lVar8 = *(long *)(p_Var10 + lVar22);
  lVar9 = *(long *)(p_Var10 + lVar22 + 0x10);
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar8 + uVar27 * lVar9);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar8 + uVar30 * lVar9);
  fVar37 = fVar37 - auVar11._0_4_;
  auVar39 = vunpcklps_avx(auVar38,auVar50);
  local_1e0 = vunpckhps_avx(auVar38,auVar50);
  auVar38 = vunpcklps_avx(_local_300,auVar54);
  local_80 = vunpckhps_avx(_local_300,auVar54);
  auVar40 = vunpcklps_avx(auVar39,auVar38);
  auVar39 = vunpckhps_avx(auVar39,auVar38);
  auVar34 = vunpcklps_avx(auVar56,auVar42);
  auVar38 = vunpckhps_avx(auVar56,auVar42);
  auVar35 = vunpcklps_avx(auVar58,auVar62);
  auVar42 = vunpckhps_avx(auVar58,auVar62);
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar8 + uVar29 * lVar9);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar8 + uVar23 * lVar9);
  auVar43 = vunpcklps_avx(auVar38,auVar42);
  auVar44 = vunpcklps_avx(auVar34,auVar35);
  auVar38 = vunpckhps_avx(auVar34,auVar35);
  auVar42 = vunpcklps_avx(auVar71,auVar74);
  auVar50 = vunpckhps_avx(auVar71,auVar74);
  auVar34 = vunpcklps_avx(auVar73,auVar76);
  local_a0 = vunpckhps_avx(auVar73,auVar76);
  auVar54 = vunpcklps_avx(auVar42,auVar34);
  auVar42 = vunpckhps_avx(auVar42,auVar34);
  auVar56 = vunpcklps_avx(auVar77,auVar59);
  auVar34 = vunpckhps_avx(auVar77,auVar59);
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar8 + uVar24 * lVar9);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar8 + uVar28 * lVar9);
  auVar60._16_16_ = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar26);
  auVar60._0_16_ = *(undefined1 (*) [16])(lVar8 + uVar21 * lVar9);
  auVar57 = vunpcklps_avx(auVar72,auVar60);
  auVar35 = vunpckhps_avx(auVar72,auVar60);
  auVar58 = vunpcklps_avx(auVar34,auVar35);
  auVar35 = vunpcklps_avx(auVar56,auVar57);
  auVar34 = vunpckhps_avx(auVar56,auVar57);
  auVar11 = vshufps_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),0);
  auVar12 = vshufps_avx(ZEXT416((uint)(1.0 - fVar37)),ZEXT416((uint)(1.0 - fVar37)),0);
  fVar47 = auVar11._0_4_;
  fVar48 = auVar11._4_4_;
  fVar49 = auVar11._8_4_;
  fVar46 = auVar11._12_4_;
  fVar61 = auVar12._0_4_;
  fVar65 = auVar12._4_4_;
  fVar66 = auVar12._8_4_;
  fVar67 = auVar12._12_4_;
  auVar63._0_4_ = fVar61 * auVar40._0_4_ + auVar54._0_4_ * fVar47;
  auVar63._4_4_ = fVar65 * auVar40._4_4_ + auVar54._4_4_ * fVar48;
  auVar63._8_4_ = fVar66 * auVar40._8_4_ + auVar54._8_4_ * fVar49;
  auVar63._12_4_ = fVar67 * auVar40._12_4_ + auVar54._12_4_ * fVar46;
  auVar63._16_4_ = fVar61 * auVar40._16_4_ + auVar54._16_4_ * fVar47;
  auVar63._20_4_ = fVar65 * auVar40._20_4_ + auVar54._20_4_ * fVar48;
  auVar63._24_4_ = fVar66 * auVar40._24_4_ + auVar54._24_4_ * fVar49;
  auVar63._28_4_ = auVar40._28_4_ + 0.0;
  auVar54 = vunpcklps_avx(local_1e0,local_80);
  local_1c0._0_4_ = auVar39._0_4_;
  local_1c0._4_4_ = auVar39._4_4_;
  fStack_1b8 = auVar39._8_4_;
  fStack_1b4 = auVar39._12_4_;
  fStack_1b0 = auVar39._16_4_;
  fStack_1ac = auVar39._20_4_;
  fStack_1a8 = auVar39._24_4_;
  local_240._0_4_ = fVar61 * (float)local_1c0._0_4_ + auVar42._0_4_ * fVar47;
  local_240._4_4_ = fVar65 * (float)local_1c0._4_4_ + auVar42._4_4_ * fVar48;
  local_240._8_4_ = fVar66 * fStack_1b8 + auVar42._8_4_ * fVar49;
  local_240._12_4_ = fVar67 * fStack_1b4 + auVar42._12_4_ * fVar46;
  local_240._16_4_ = fVar61 * fStack_1b0 + auVar42._16_4_ * fVar47;
  local_240._20_4_ = fVar65 * fStack_1ac + auVar42._20_4_ * fVar48;
  local_240._24_4_ = fVar66 * fStack_1a8 + auVar42._24_4_ * fVar49;
  local_240._28_4_ = local_80._28_4_ + auVar40._28_4_;
  _local_1c0 = auVar50;
  auVar39 = vunpcklps_avx(auVar50,local_a0);
  auVar75._0_4_ = fVar61 * auVar54._0_4_ + fVar47 * auVar39._0_4_;
  auVar75._4_4_ = fVar65 * auVar54._4_4_ + fVar48 * auVar39._4_4_;
  auVar75._8_4_ = fVar66 * auVar54._8_4_ + fVar49 * auVar39._8_4_;
  auVar75._12_4_ = fVar67 * auVar54._12_4_ + fVar46 * auVar39._12_4_;
  auVar75._16_4_ = fVar61 * auVar54._16_4_ + fVar47 * auVar39._16_4_;
  auVar75._20_4_ = fVar65 * auVar54._20_4_ + fVar48 * auVar39._20_4_;
  auVar75._24_4_ = fVar66 * auVar54._24_4_ + fVar49 * auVar39._24_4_;
  auVar75._28_4_ = auVar54._28_4_ + auVar39._28_4_;
  local_200._0_4_ = auVar44._0_4_;
  local_200._4_4_ = auVar44._4_4_;
  uStack_1f8._0_4_ = auVar44._8_4_;
  uStack_1f8._4_4_ = auVar44._12_4_;
  uStack_1f0._0_4_ = auVar44._16_4_;
  uStack_1f0._4_4_ = auVar44._20_4_;
  uStack_1e8._0_4_ = auVar44._24_4_;
  fVar13 = local_a0._28_4_;
  fVar53 = fVar61 * (float)local_200 + auVar35._0_4_ * fVar47;
  fVar55 = fVar65 * local_200._4_4_ + auVar35._4_4_ * fVar48;
  uStack_1f8._0_4_ = fVar66 * (float)uStack_1f8 + auVar35._8_4_ * fVar49;
  uStack_1f8._4_4_ = fVar67 * uStack_1f8._4_4_ + auVar35._12_4_ * fVar46;
  uStack_1f0._0_4_ = fVar61 * (float)uStack_1f0 + auVar35._16_4_ * fVar47;
  uStack_1f0._4_4_ = fVar65 * uStack_1f0._4_4_ + auVar35._20_4_ * fVar48;
  uStack_1e8._0_4_ = fVar66 * (float)uStack_1e8 + auVar35._24_4_ * fVar49;
  local_260 = auVar38._0_4_;
  fStack_25c = auVar38._4_4_;
  fStack_258 = auVar38._8_4_;
  fStack_254 = auVar38._12_4_;
  fStack_250 = auVar38._16_4_;
  fStack_24c = auVar38._20_4_;
  fStack_248 = auVar38._24_4_;
  local_c0 = fVar61 * local_260 + fVar47 * auVar34._0_4_;
  fStack_bc = fVar65 * fStack_25c + fVar48 * auVar34._4_4_;
  fStack_b8 = fVar66 * fStack_258 + fVar49 * auVar34._8_4_;
  fStack_b4 = fVar67 * fStack_254 + fVar46 * auVar34._12_4_;
  fStack_b0 = fVar61 * fStack_250 + fVar47 * auVar34._16_4_;
  fStack_ac = fVar65 * fStack_24c + fVar48 * auVar34._20_4_;
  fStack_a8 = fVar66 * fStack_248 + fVar49 * auVar34._24_4_;
  fStack_a4 = fVar13 + auVar34._28_4_;
  local_300._0_4_ = auVar43._0_4_;
  local_300._4_4_ = auVar43._4_4_;
  fStack_2f8 = auVar43._8_4_;
  fStack_2f4 = auVar43._12_4_;
  uStack_2f0._0_4_ = auVar43._16_4_;
  uStack_2f0._4_4_ = auVar43._20_4_;
  uStack_2e8._0_4_ = auVar43._24_4_;
  local_190 = vshufps_avx(ZEXT416(uVar17),ZEXT416(uVar17),0);
  local_1a0 = local_190;
  fStack_25c = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_e0[0] = auVar58._0_4_ * fVar47 + fVar61 * (float)local_300._0_4_;
  local_e0[1] = auVar58._4_4_ * fVar48 + fVar65 * (float)local_300._4_4_;
  local_e0[2] = auVar58._8_4_ * fVar49 + fVar66 * fStack_2f8;
  local_e0[3] = auVar58._12_4_ * fVar46 + fVar67 * fStack_2f4;
  fStack_d0 = auVar58._16_4_ * fVar47 + fVar61 * (float)uStack_2f0;
  fStack_cc = auVar58._20_4_ * fVar48 + fVar65 * uStack_2f0._4_4_;
  fStack_c8 = auVar58._24_4_ * fVar49 + fVar66 * (float)uStack_2e8;
  fVar37 = (ray->super_RayK<1>).dir.field_0.m128[2];
  local_260 = fStack_25c;
  fStack_258 = fStack_25c;
  fStack_254 = fStack_25c;
  fStack_250 = fStack_25c;
  fStack_24c = fStack_25c;
  fStack_248 = fStack_25c;
  fStack_244 = fStack_25c;
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar34._0_4_ = fVar2 * fVar53 + fStack_25c * local_c0 + fVar37 * local_e0[0];
  auVar34._4_4_ = fVar2 * fVar55 + fStack_25c * fStack_bc + fVar37 * local_e0[1];
  auVar34._8_4_ = fVar2 * (float)uStack_1f8 + fStack_25c * fStack_b8 + fVar37 * local_e0[2];
  auVar34._12_4_ = fVar2 * uStack_1f8._4_4_ + fStack_25c * fStack_b4 + fVar37 * local_e0[3];
  auVar34._16_4_ = fVar2 * (float)uStack_1f0 + fStack_25c * fStack_b0 + fVar37 * fStack_d0;
  auVar34._20_4_ = fVar2 * uStack_1f0._4_4_ + fStack_25c * fStack_ac + fVar37 * fStack_cc;
  auVar34._24_4_ = fVar2 * (float)uStack_1e8 + fStack_25c * fStack_a8 + fVar37 * fStack_c8;
  auVar34._28_4_ = auVar50._28_4_ + fStack_25c + fVar13;
  auVar11 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar39._16_16_ = auVar11;
  auVar39._0_16_ = auVar11;
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar38 = vcmpps_avx(_DAT_01faff40,auVar39,1);
  auVar42 = vcmpps_avx(auVar34,ZEXT1632(ZEXT816(0) << 0x40),0);
  auVar78._8_4_ = 0x3f800000;
  auVar78._0_8_ = 0x3f8000003f800000;
  auVar78._12_4_ = 0x3f800000;
  auVar78._16_4_ = 0x3f800000;
  auVar78._20_4_ = 0x3f800000;
  auVar78._24_4_ = 0x3f800000;
  auVar78._28_4_ = 0x3f800000;
  auVar39 = vblendvps_avx(auVar34,auVar78,auVar42);
  fVar3 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar35._4_4_ = fVar3;
  auVar35._0_4_ = fVar3;
  auVar35._8_4_ = fVar3;
  auVar35._12_4_ = fVar3;
  auVar35._16_4_ = fVar3;
  auVar35._20_4_ = fVar3;
  auVar35._24_4_ = fVar3;
  auVar35._28_4_ = fVar3;
  auVar38 = vandnps_avx(auVar42,auVar38);
  fVar4 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar79._4_4_ = fVar4;
  auVar79._0_4_ = fVar4;
  auVar79._8_4_ = fVar4;
  auVar79._12_4_ = fVar4;
  auVar79._16_4_ = fVar4;
  auVar79._20_4_ = fVar4;
  auVar79._24_4_ = fVar4;
  auVar79._28_4_ = fVar4;
  _local_300 = auVar75;
  auVar42 = vsubps_avx(auVar75,auVar79);
  auVar34 = vsubps_avx(local_240,auVar35);
  fVar5 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar40._4_4_ = fVar5;
  auVar40._0_4_ = fVar5;
  auVar40._8_4_ = fVar5;
  auVar40._12_4_ = fVar5;
  auVar40._16_4_ = fVar5;
  auVar40._20_4_ = fVar5;
  auVar40._24_4_ = fVar5;
  auVar40._28_4_ = fVar5;
  auVar35 = vsubps_avx(auVar63,auVar40);
  local_200 = CONCAT44(fVar55,fVar53);
  auVar15 = _local_200;
  uStack_1e8._4_4_ = fVar13 + auVar54._28_4_;
  auVar40 = _local_200;
  auVar43._0_4_ = auVar35._0_4_ * fVar53 + local_c0 * auVar34._0_4_ + local_e0[0] * auVar42._0_4_;
  auVar43._4_4_ = auVar35._4_4_ * fVar55 + fStack_bc * auVar34._4_4_ + local_e0[1] * auVar42._4_4_;
  auVar43._8_4_ =
       auVar35._8_4_ * (float)uStack_1f8 + fStack_b8 * auVar34._8_4_ + local_e0[2] * auVar42._8_4_;
  auVar43._12_4_ =
       auVar35._12_4_ * uStack_1f8._4_4_ + fStack_b4 * auVar34._12_4_ + local_e0[3] * auVar42._12_4_
  ;
  auVar43._16_4_ =
       auVar35._16_4_ * (float)uStack_1f0 + fStack_b0 * auVar34._16_4_ + fStack_d0 * auVar42._16_4_;
  auVar43._20_4_ =
       auVar35._20_4_ * uStack_1f0._4_4_ + fStack_ac * auVar34._20_4_ + fStack_cc * auVar42._20_4_;
  auVar43._24_4_ =
       auVar35._24_4_ * (float)uStack_1e8 + fStack_a8 * auVar34._24_4_ + fStack_c8 * auVar42._24_4_;
  auVar43._28_4_ = auVar35._28_4_ + auVar34._28_4_ + auVar42._28_4_;
  local_140 = vdivps_avx(auVar43,auVar39);
  auVar64 = ZEXT3264(local_140);
  uVar6 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar44._4_4_ = uVar6;
  auVar44._0_4_ = uVar6;
  auVar44._8_4_ = uVar6;
  auVar44._12_4_ = uVar6;
  auVar44._16_4_ = uVar6;
  auVar44._20_4_ = uVar6;
  auVar44._24_4_ = uVar6;
  auVar44._28_4_ = uVar6;
  fVar53 = (ray->super_RayK<1>).tfar;
  auVar57._4_4_ = fVar53;
  auVar57._0_4_ = fVar53;
  auVar57._8_4_ = fVar53;
  auVar57._12_4_ = fVar53;
  auVar57._16_4_ = fVar53;
  auVar57._20_4_ = fVar53;
  auVar57._24_4_ = fVar53;
  auVar57._28_4_ = fVar53;
  auVar39 = vcmpps_avx(auVar44,local_140,2);
  auVar42 = vcmpps_avx(local_140,auVar57,2);
  auVar39 = vandps_avx(auVar39,auVar42);
  auVar42 = auVar38 & auVar39;
  if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar42 >> 0x7f,0) != '\0') ||
        (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar42 >> 0xbf,0) != '\0') ||
      (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar42[0x1f] < '\0') {
    auVar39 = vandps_avx(auVar38,auVar39);
    auVar38 = vunpckhps_avx(local_1e0,local_80);
    auVar42 = vunpckhps_avx(auVar50,local_a0);
    fVar53 = fVar61 * auVar38._0_4_ + fVar47 * auVar42._0_4_;
    fVar55 = fVar65 * auVar38._4_4_ + fVar48 * auVar42._4_4_;
    fVar45 = fVar66 * auVar38._8_4_ + fVar49 * auVar42._8_4_;
    fVar46 = fVar67 * auVar38._12_4_ + fVar46 * auVar42._12_4_;
    fVar47 = fVar61 * auVar38._16_4_ + fVar47 * auVar42._16_4_;
    fVar48 = fVar65 * auVar38._20_4_ + fVar48 * auVar42._20_4_;
    fVar49 = fVar66 * auVar38._24_4_ + fVar49 * auVar42._24_4_;
    fVar61 = local_140._0_4_;
    fVar65 = local_140._4_4_;
    fVar66 = local_140._8_4_;
    fVar67 = local_140._12_4_;
    fVar68 = local_140._16_4_;
    fVar69 = local_140._20_4_;
    fVar70 = local_140._24_4_;
    auVar31._0_4_ = fVar5 + fVar61 * fVar2;
    auVar31._4_4_ = fVar5 + fVar65 * fVar2;
    auVar31._8_4_ = fVar5 + fVar66 * fVar2;
    auVar31._12_4_ = fVar5 + fVar67 * fVar2;
    auVar31._16_4_ = fVar5 + fVar68 * fVar2;
    auVar31._20_4_ = fVar5 + fVar69 * fVar2;
    auVar31._24_4_ = fVar5 + fVar70 * fVar2;
    auVar31._28_4_ = fVar5 + fVar2;
    auVar36._0_4_ = fVar3 + fVar61 * fStack_25c;
    auVar36._4_4_ = fVar3 + fVar65 * fStack_25c;
    auVar36._8_4_ = fVar3 + fVar66 * fStack_25c;
    auVar36._12_4_ = fVar3 + fVar67 * fStack_25c;
    auVar36._16_4_ = fVar3 + fVar68 * fStack_25c;
    auVar36._20_4_ = fVar3 + fVar69 * fStack_25c;
    auVar36._24_4_ = fVar3 + fVar70 * fStack_25c;
    auVar36._28_4_ = fVar3 + fVar5;
    auVar41._0_4_ = fVar4 + fVar37 * fVar61;
    auVar41._4_4_ = fVar4 + fVar37 * fVar65;
    auVar41._8_4_ = fVar4 + fVar37 * fVar66;
    auVar41._12_4_ = fVar4 + fVar37 * fVar67;
    auVar41._16_4_ = fVar4 + fVar37 * fVar68;
    auVar41._20_4_ = fVar4 + fVar37 * fVar69;
    auVar41._24_4_ = fVar4 + fVar37 * fVar70;
    auVar41._28_4_ = fVar4 + fVar5;
    auVar38 = vsubps_avx(auVar31,auVar63);
    auVar42 = vsubps_avx(auVar36,local_240);
    auVar34 = vsubps_avx(auVar41,auVar75);
    fVar37 = auVar42._28_4_ + auVar34._28_4_;
    auVar32._0_4_ =
         auVar38._0_4_ * auVar38._0_4_ +
         auVar42._0_4_ * auVar42._0_4_ + auVar34._0_4_ * auVar34._0_4_;
    auVar32._4_4_ =
         auVar38._4_4_ * auVar38._4_4_ +
         auVar42._4_4_ * auVar42._4_4_ + auVar34._4_4_ * auVar34._4_4_;
    auVar32._8_4_ =
         auVar38._8_4_ * auVar38._8_4_ +
         auVar42._8_4_ * auVar42._8_4_ + auVar34._8_4_ * auVar34._8_4_;
    auVar32._12_4_ =
         auVar38._12_4_ * auVar38._12_4_ +
         auVar42._12_4_ * auVar42._12_4_ + auVar34._12_4_ * auVar34._12_4_;
    auVar32._16_4_ =
         auVar38._16_4_ * auVar38._16_4_ +
         auVar42._16_4_ * auVar42._16_4_ + auVar34._16_4_ * auVar34._16_4_;
    auVar32._20_4_ =
         auVar38._20_4_ * auVar38._20_4_ +
         auVar42._20_4_ * auVar42._20_4_ + auVar34._20_4_ * auVar34._20_4_;
    auVar32._24_4_ =
         auVar38._24_4_ * auVar38._24_4_ +
         auVar42._24_4_ * auVar42._24_4_ + auVar34._24_4_ * auVar34._24_4_;
    auVar32._28_4_ = auVar38._28_4_ + fVar37;
    auVar14._4_4_ = fVar55 * fVar55;
    auVar14._0_4_ = fVar53 * fVar53;
    auVar14._8_4_ = fVar45 * fVar45;
    auVar14._12_4_ = fVar46 * fVar46;
    auVar14._16_4_ = fVar47 * fVar47;
    auVar14._20_4_ = fVar48 * fVar48;
    auVar14._24_4_ = fVar49 * fVar49;
    auVar14._28_4_ = fVar37;
    auVar38 = vcmpps_avx(auVar32,auVar14,1);
    auVar42 = auVar39 & auVar38;
    if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar42 >> 0x7f,0) != '\0') ||
          (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar42 >> 0xbf,0) != '\0') ||
        (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar42[0x1f] < '\0')
    {
      uVar17 = (ray->super_RayK<1>).mask;
      fVar37 = (ray->super_RayK<1>).tfar;
      auVar39 = vandps_avx(auVar39,auVar38);
      local_160 = ZEXT432(0) << 0x20;
      local_180 = ZEXT432(0) << 0x20;
      uStack_1f0 = auVar15._16_8_;
      uStack_1e8 = auVar40._24_8_;
      local_120 = local_200;
      uStack_118 = uStack_1f8;
      uStack_110 = uStack_1f0;
      uStack_108 = uStack_1e8;
      local_100 = CONCAT44(fStack_bc,local_c0);
      uStack_f8 = CONCAT44(fStack_b4,fStack_b8);
      uStack_f0 = CONCAT44(fStack_ac,fStack_b0);
      uStack_e8 = CONCAT44(fStack_a4,fStack_a8);
      fStack_c4 = auVar58._28_4_ + fVar13;
      local_220 = auVar39;
      auVar51._8_4_ = 0x7f800000;
      auVar51._0_8_ = 0x7f8000007f800000;
      auVar51._12_4_ = 0x7f800000;
      auVar51._16_4_ = 0x7f800000;
      auVar51._20_4_ = 0x7f800000;
      auVar51._24_4_ = 0x7f800000;
      auVar51._28_4_ = 0x7f800000;
      auVar52 = ZEXT3264(auVar51);
      auVar38 = vblendvps_avx(auVar51,local_140,auVar39);
      auVar42 = vshufps_avx(auVar38,auVar38,0xb1);
      auVar42 = vminps_avx(auVar38,auVar42);
      auVar34 = vshufpd_avx(auVar42,auVar42,5);
      auVar42 = vminps_avx(auVar42,auVar34);
      auVar34 = vperm2f128_avx(auVar42,auVar42,1);
      auVar42 = vminps_avx(auVar42,auVar34);
      auVar38 = vcmpps_avx(auVar38,auVar42,0);
      auVar42 = auVar39 & auVar38;
      if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar42 >> 0x7f,0) != '\0') ||
            (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar42 >> 0xbf,0) != '\0') ||
          (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar42[0x1f] < '\0') {
        auVar39 = vandps_avx(auVar38,auVar39);
      }
      uVar19 = vmovmskps_avx(auVar39);
      uVar20 = 0;
      _local_200 = auVar40;
      if (uVar19 != 0) {
        for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
      do {
        uVar21 = (ulong)uVar20;
        local_2b8 = *(uint *)(local_1a0 + uVar21 * 4);
        pGVar7 = (pSVar25->geometries).items[local_2b8].ptr;
        if ((pGVar7->mask & uVar17) == 0) {
          *(undefined4 *)(local_220 + uVar21 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar37 = *(float *)(local_180 + uVar21 * 4);
            fVar2 = *(float *)(local_160 + uVar21 * 4);
            (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar21 * 4);
            (ray->Ng).field_0.field_0.x = *(float *)((long)&local_120 + uVar21 * 4);
            (ray->Ng).field_0.field_0.y = *(float *)((long)&local_100 + uVar21 * 4);
            (ray->Ng).field_0.field_0.z = local_e0[uVar21];
            ray->u = fVar37;
            ray->v = fVar2;
            ray->primID = (Disc->primIDs).field_0.i[uVar21];
            ray->geomID = local_2b8;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_300._0_4_ = fVar37;
          local_240 = auVar64._0_32_;
          local_2d0 = *(float *)((long)&local_120 + uVar21 * 4);
          local_2cc = *(undefined4 *)((long)&local_100 + uVar21 * 4);
          local_2c8 = local_e0[uVar21];
          local_2c4 = *(undefined4 *)(local_180 + uVar21 * 4);
          local_2c0 = *(undefined4 *)(local_160 + uVar21 * 4);
          local_2bc = (Disc->primIDs).field_0.i[uVar21];
          local_2b4 = context->user->instID[0];
          local_2b0 = context->user->instPrimID[0];
          (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar21 * 4);
          local_314 = -1;
          local_290.valid = &local_314;
          local_290.geometryUserPtr = pGVar7->userPtr;
          local_290.context = context->user;
          local_290.ray = (RTCRayN *)ray;
          local_290.hit = (RTCHitN *)&local_2d0;
          local_290.N = 1;
          if ((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar7->intersectionFilterN)(&local_290), *local_290.valid != 0)) {
            p_Var10 = context->args->filter;
            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                  RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)) &&
                ((*p_Var10)(&local_290), *local_290.valid == 0)))) goto LAB_010e897d;
            (((Vec3f *)((long)local_290.ray + 0x30))->field_0).field_0.x = *(float *)local_290.hit;
            (((Vec3f *)((long)local_290.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_290.hit + 4);
            (((Vec3f *)((long)local_290.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_290.hit + 8);
            *(float *)((long)local_290.ray + 0x3c) = *(float *)(local_290.hit + 0xc);
            *(float *)((long)local_290.ray + 0x40) = *(float *)(local_290.hit + 0x10);
            *(float *)((long)local_290.ray + 0x44) = *(float *)(local_290.hit + 0x14);
            *(float *)((long)local_290.ray + 0x48) = *(float *)(local_290.hit + 0x18);
            *(float *)((long)local_290.ray + 0x4c) = *(float *)(local_290.hit + 0x1c);
            *(float *)((long)local_290.ray + 0x50) = *(float *)(local_290.hit + 0x20);
          }
          else {
LAB_010e897d:
            (ray->super_RayK<1>).tfar = (float)local_300._0_4_;
          }
          auVar52 = ZEXT3264(CONCAT428(0x7f800000,
                                       CONCAT424(0x7f800000,
                                                 CONCAT420(0x7f800000,
                                                           CONCAT416(0x7f800000,
                                                                     CONCAT412(0x7f800000,
                                                                               CONCAT48(0x7f800000,
                                                                                                                                                                                
                                                  0x7f8000007f800000)))))));
          *(undefined4 *)(local_220 + uVar21 * 4) = 0;
          fVar37 = (ray->super_RayK<1>).tfar;
          auVar33._4_4_ = fVar37;
          auVar33._0_4_ = fVar37;
          auVar33._8_4_ = fVar37;
          auVar33._12_4_ = fVar37;
          auVar33._16_4_ = fVar37;
          auVar33._20_4_ = fVar37;
          auVar33._24_4_ = fVar37;
          auVar33._28_4_ = fVar37;
          auVar64 = ZEXT3264(local_240);
          auVar39 = vcmpps_avx(local_240,auVar33,2);
          local_220 = vandps_avx(auVar39,local_220);
          uVar17 = (ray->super_RayK<1>).mask;
          fVar37 = (ray->super_RayK<1>).tfar;
          pSVar25 = local_310;
        }
        if ((((((((local_220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_220 >> 0x7f,0) == '\0') &&
              (local_220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_220 >> 0xbf,0) == '\0') &&
            (local_220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_220[0x1f]) {
          return;
        }
        auVar39 = vblendvps_avx(auVar52._0_32_,auVar64._0_32_,local_220);
        auVar38 = vshufps_avx(auVar39,auVar39,0xb1);
        auVar38 = vminps_avx(auVar39,auVar38);
        auVar42 = vshufpd_avx(auVar38,auVar38,5);
        auVar38 = vminps_avx(auVar38,auVar42);
        auVar42 = vperm2f128_avx(auVar38,auVar38,1);
        auVar38 = vminps_avx(auVar38,auVar42);
        auVar38 = vcmpps_avx(auVar39,auVar38,0);
        auVar42 = local_220 & auVar38;
        auVar39 = local_220;
        if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar42 >> 0x7f,0) != '\0') ||
              (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar42 >> 0xbf,0) != '\0') ||
            (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar42[0x1f] < '\0') {
          auVar39 = vandps_avx(auVar38,local_220);
        }
        uVar19 = vmovmskps_avx(auVar39);
        uVar20 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }